

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overdrawoptimizer.cpp
# Opt level: O1

void meshopt_optimizeOverdraw
               (uint *destination,uint *indices,size_t index_count,float *vertex_positions,
               size_t vertex_count,size_t vertex_positions_stride,float threshold)

{
  ulong uVar1;
  size_t __n;
  undefined8 *puVar2;
  ushort uVar3;
  uint uVar4;
  size_t i;
  void *pvVar5;
  void *pvVar6;
  uint *puVar7;
  void *pvVar8;
  size_t sVar9;
  void *pvVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t i_2;
  ulong uVar15;
  size_t sVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  size_t i_1;
  ulong uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  char cVar28;
  bool bVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined4 uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  meshopt_Allocator allocator;
  uint *local_21f8;
  ulong local_21d8;
  undefined8 local_2100 [24];
  long local_2040;
  uint local_2038 [2050];
  
  memset(local_2100,0,200);
  lVar24 = local_2040;
  if (vertex_count != 0 && index_count != 0) {
    local_21f8 = indices;
    if (destination == indices) {
      sVar17 = 0xffffffffffffffff;
      if (index_count < 0x4000000000000000) {
        sVar17 = index_count * 4;
      }
      local_21f8 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(sVar17);
      puVar2 = local_2100 + local_2040;
      local_2040 = local_2040 + 1;
      *puVar2 = local_21f8;
      memcpy(local_21f8,indices,index_count * 4);
    }
    __n = vertex_count * 4;
    sVar16 = __n;
    if (0x3fffffffffffffff < vertex_count) {
      sVar16 = 0xffffffffffffffff;
    }
    pvVar5 = (*meshopt_Allocator::StorageT<void>::allocate)(sVar16);
    puVar2 = local_2100 + local_2040;
    local_2040 = local_2040 + 1;
    *puVar2 = pvVar5;
    uVar13 = index_count / 3;
    sVar17 = uVar13 * 4;
    if (0xbfffffffffffffff < index_count) {
      sVar17 = 0xffffffffffffffff;
    }
    pvVar6 = (*meshopt_Allocator::StorageT<void>::allocate)(sVar17);
    puVar2 = local_2100 + local_2040;
    local_2040 = local_2040 + 1;
    *puVar2 = pvVar6;
    local_21d8 = 0;
    memset(pvVar5,0,__n);
    if (2 < index_count) {
      puVar7 = local_21f8 + 2;
      iVar11 = 0x11;
      local_21d8 = 0;
      uVar14 = 0;
      do {
        uVar12 = puVar7[-1];
        uVar20 = *puVar7;
        cVar28 = 0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)puVar7[-2] * 4));
        if ((bool)cVar28) {
          *(int *)((long)pvVar5 + (ulong)puVar7[-2] * 4) = iVar11;
          iVar11 = iVar11 + 1;
        }
        if (0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)uVar12 * 4))) {
          *(int *)((long)pvVar5 + (ulong)uVar12 * 4) = iVar11;
          iVar11 = iVar11 + 1;
          cVar28 = cVar28 + '\x01';
        }
        if (0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)uVar20 * 4))) {
          *(int *)((long)pvVar5 + (ulong)uVar20 * 4) = iVar11;
          iVar11 = iVar11 + 1;
          cVar28 = cVar28 + '\x01';
        }
        if ((uVar14 == 0) || (cVar28 == '\x03')) {
          *(int *)((long)pvVar6 + local_21d8 * 4) = (int)uVar14;
          local_21d8 = local_21d8 + 1;
        }
        uVar14 = uVar14 + 1;
        puVar7 = puVar7 + 3;
      } while (uVar13 != uVar14);
    }
    sVar17 = 0xffffffffffffffff;
    if (index_count < 0xbffffffffffffffd) {
      sVar17 = uVar13 * 4 + 4;
    }
    pvVar8 = (*meshopt_Allocator::StorageT<void>::allocate)(sVar17);
    puVar2 = local_2100 + local_2040;
    local_2040 = local_2040 + 1;
    *puVar2 = pvVar8;
    iVar11 = 0;
    memset(pvVar5,0,__n);
    if (local_21d8 == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      uVar18 = 0;
      do {
        uVar1 = uVar18 + 1;
        uVar23 = uVar13;
        if (uVar1 < local_21d8) {
          uVar23 = (ulong)*(uint *)((long)pvVar6 + uVar1 * 4);
        }
        uVar12 = *(uint *)((long)pvVar6 + uVar18 * 4);
        uVar18 = (ulong)uVar12;
        iVar11 = iVar11 + 0x11;
        fVar30 = 0.0;
        uVar19 = uVar23 - uVar18;
        if (uVar18 <= uVar23 && uVar19 != 0) {
          puVar7 = local_21f8 + uVar18 * 3 + 2;
          uVar20 = 0;
          uVar15 = uVar19;
          do {
            uVar22 = puVar7[-1];
            uVar4 = *puVar7;
            bVar29 = 0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)puVar7[-2] * 4));
            if (bVar29) {
              *(int *)((long)pvVar5 + (ulong)puVar7[-2] * 4) = iVar11;
              iVar11 = iVar11 + 1;
            }
            uVar26 = (uint)bVar29;
            if (0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)uVar22 * 4))) {
              *(int *)((long)pvVar5 + (ulong)uVar22 * 4) = iVar11;
              iVar11 = iVar11 + 1;
              uVar26 = bVar29 + 1;
            }
            if (0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)uVar4 * 4))) {
              *(int *)((long)pvVar5 + (ulong)uVar4 * 4) = iVar11;
              iVar11 = iVar11 + 1;
              uVar26 = uVar26 + 1;
            }
            uVar20 = uVar20 + uVar26;
            puVar7 = puVar7 + 3;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
          fVar30 = (float)uVar20;
        }
        lVar24 = uVar14 + 1;
        iVar11 = iVar11 + 0x11;
        *(uint *)((long)pvVar8 + uVar14 * 4) = uVar12;
        if (uVar18 < uVar23) {
          puVar7 = local_21f8 + uVar18 * 3 + 2;
          uVar20 = 0;
          uVar22 = 0;
          do {
            uVar4 = puVar7[-1];
            uVar26 = *puVar7;
            bVar29 = 0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)puVar7[-2] * 4));
            if (bVar29) {
              *(int *)((long)pvVar5 + (ulong)puVar7[-2] * 4) = iVar11;
              iVar11 = iVar11 + 1;
            }
            uVar21 = (uint)bVar29;
            if (0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)uVar4 * 4))) {
              *(int *)((long)pvVar5 + (ulong)uVar4 * 4) = iVar11;
              iVar11 = iVar11 + 1;
              uVar21 = uVar21 + 1;
            }
            if (0x10 < (uint)(iVar11 - *(int *)((long)pvVar5 + (ulong)uVar26 * 4))) {
              *(int *)((long)pvVar5 + (ulong)uVar26 * 4) = iVar11;
              iVar11 = iVar11 + 1;
              uVar21 = uVar21 + 1;
            }
            uVar22 = uVar21 + uVar22;
            uVar20 = uVar20 + 1;
            if ((float)uVar22 / (float)uVar20 <= (fVar30 / (float)uVar19) * threshold) {
              *(int *)((long)pvVar8 + lVar24 * 4) = (int)uVar18 + 1;
              lVar24 = lVar24 + 1;
              iVar11 = iVar11 + 0x11;
              uVar22 = 0;
              uVar20 = 0;
            }
            uVar18 = uVar18 + 1;
            puVar7 = puVar7 + 3;
          } while (uVar23 != uVar18);
        }
        uVar14 = lVar24 - (ulong)(*(uint *)((long)pvVar8 + lVar24 * 4 + -4) != uVar12);
        uVar18 = uVar1;
      } while (uVar1 != local_21d8);
    }
    sVar17 = 0xffffffffffffffff;
    if (uVar14 < 0x4000000000000000) {
      sVar17 = uVar14 * 4;
    }
    pvVar5 = (*meshopt_Allocator::StorageT<void>::allocate)(sVar17);
    puVar2 = local_2100 + local_2040;
    local_2040 = local_2040 + 1;
    *puVar2 = pvVar5;
    uVar13 = vertex_positions_stride >> 2;
    fVar30 = 0.0;
    fVar36 = 0.0;
    fVar37 = 0.0;
    sVar9 = 0;
    do {
      fVar37 = fVar37 + vertex_positions[local_21f8[sVar9] * uVar13];
      fVar30 = fVar30 + (float)*(undefined8 *)(vertex_positions + local_21f8[sVar9] * uVar13 + 1);
      fVar36 = fVar36 + (float)((ulong)*(undefined8 *)
                                        (vertex_positions + local_21f8[sVar9] * uVar13 + 1) >> 0x20)
      ;
      sVar9 = sVar9 + 1;
    } while (index_count != sVar9);
    fVar31 = (float)index_count;
    if (uVar14 != 0) {
      uVar18 = 0;
      do {
        uVar1 = uVar18 + 1;
        sVar9 = index_count;
        if (uVar1 < uVar14) {
          sVar9 = (size_t)(uint)(*(int *)((long)pvVar8 + uVar1 * 4) * 3);
        }
        uVar23 = (ulong)(uint)(*(int *)((long)pvVar8 + uVar18 * 4) * 3);
        fVar44 = 0.0;
        fVar45 = 0.0;
        if (uVar23 < sVar9) {
          fVar47 = 0.0;
          fVar46 = 0.0;
          fVar43 = 0.0;
          fVar42 = 0.0;
          fVar40 = 0.0;
          do {
            lVar24 = local_21f8[uVar23] * uVar13;
            lVar27 = local_21f8[uVar23 + 1] * uVar13;
            lVar25 = local_21f8[uVar23 + 2] * uVar13;
            fVar32 = vertex_positions[lVar27] - vertex_positions[lVar24];
            fVar34 = vertex_positions[lVar27 + 1] - vertex_positions[lVar24 + 1];
            fVar48 = vertex_positions[lVar27 + 2] - vertex_positions[lVar24 + 2];
            fVar39 = vertex_positions[lVar25] - vertex_positions[lVar24];
            fVar49 = vertex_positions[lVar25 + 1] - vertex_positions[lVar24 + 1];
            fVar35 = vertex_positions[lVar25 + 2] - vertex_positions[lVar24 + 2];
            fVar38 = fVar34 * fVar35 - fVar49 * fVar48;
            fVar35 = fVar48 * fVar39 - fVar35 * fVar32;
            fVar34 = fVar49 * fVar32 - fVar39 * fVar34;
            fVar32 = fVar34 * fVar34 + fVar38 * fVar38 + fVar35 * fVar35;
            if (fVar32 < 0.0) {
              fVar32 = sqrtf(fVar32);
            }
            else {
              fVar32 = SQRT(fVar32);
            }
            fVar39 = fVar32 / 3.0;
            fVar44 = fVar44 + fVar39 * ((float)*(undefined8 *)(vertex_positions + lVar25) +
                                       (float)*(undefined8 *)(vertex_positions + lVar27) +
                                       (float)*(undefined8 *)(vertex_positions + lVar24));
            fVar45 = fVar45 + fVar39 * ((float)((ulong)*(undefined8 *)(vertex_positions + lVar25) >>
                                               0x20) +
                                       (float)((ulong)*(undefined8 *)(vertex_positions + lVar27) >>
                                              0x20) +
                                       (float)((ulong)*(undefined8 *)(vertex_positions + lVar24) >>
                                              0x20));
            fVar46 = fVar46 + (vertex_positions[lVar24 + 2] + vertex_positions[lVar27 + 2] +
                              vertex_positions[lVar25 + 2]) * fVar39;
            fVar43 = fVar43 + fVar38;
            fVar42 = fVar42 + fVar35;
            fVar40 = fVar40 + fVar34;
            fVar47 = fVar47 + fVar32;
            uVar23 = uVar23 + 3;
          } while (uVar23 < sVar9);
        }
        else {
          fVar40 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
        }
        uVar41 = 0;
        fVar32 = fVar40 * fVar40 + fVar43 * fVar43 + fVar42 * fVar42;
        if (fVar32 < 0.0) {
          fVar32 = sqrtf(fVar32);
          uVar41 = extraout_XMM0_Db;
        }
        else {
          fVar32 = SQRT(fVar32);
        }
        auVar33._4_4_ = fVar32;
        auVar33._0_4_ = fVar47;
        auVar33._8_4_ = 0;
        auVar33._12_4_ = uVar41;
        auVar33 = divps(_DAT_00248ce0,auVar33);
        fVar47 = (float)(-(uint)(fVar47 != 0.0) & auVar33._0_4_);
        fVar32 = (float)(-(uint)(fVar32 != 0.0) & auVar33._4_4_);
        *(float *)((long)pvVar5 + uVar18 * 4) =
             fVar42 * fVar32 * (fVar45 * fVar47 - fVar30 / fVar31) +
             fVar43 * fVar32 * (fVar44 * fVar47 - fVar37 / fVar31) +
             fVar40 * fVar32 * (fVar46 * fVar47 - fVar36 / fVar31);
        uVar18 = uVar1;
      } while (uVar1 != uVar14);
    }
    sVar9 = 0xffffffffffffffff;
    if (-1 < (long)uVar14) {
      sVar9 = uVar14 * 2;
    }
    pvVar6 = (*meshopt_Allocator::StorageT<void>::allocate)(sVar9);
    puVar2 = local_2100 + local_2040;
    local_2040 = local_2040 + 1;
    *puVar2 = pvVar6;
    pvVar10 = (*meshopt_Allocator::StorageT<void>::allocate)(sVar17);
    puVar2 = local_2100 + local_2040;
    local_2040 = local_2040 + 1;
    *puVar2 = pvVar10;
    if (uVar14 == 0) {
      fVar30 = 0.001;
    }
    else {
      fVar30 = 0.001;
      uVar13 = 0;
      do {
        fVar36 = ABS(*(float *)((long)pvVar5 + uVar13 * 4));
        if (fVar36 <= fVar30) {
          fVar36 = fVar30;
        }
        fVar30 = fVar36;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
    if (uVar14 == 0) {
      memset(local_2038,0,0x2000);
    }
    else {
      uVar13 = 0;
      do {
        fVar36 = (*(float *)((long)pvVar5 + uVar13 * 4) / fVar30) * -0.5 + 0.5;
        fVar36 = (float)(-(uint)(0.0 <= fVar36) & (uint)fVar36);
        if (1.0 <= fVar36) {
          fVar36 = 1.0;
        }
        *(ushort *)((long)pvVar6 + uVar13 * 2) = (ushort)(int)(fVar36 * 2047.0 + 0.5) & 0x7ff;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
      uVar13 = 0;
      memset(local_2038,0,0x2000);
      do {
        local_2038[*(ushort *)((long)pvVar6 + uVar13 * 2)] =
             local_2038[*(ushort *)((long)pvVar6 + uVar13 * 2)] + 1;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
    lVar24 = 0;
    uVar12 = 0;
    do {
      uVar20 = local_2038[lVar24];
      local_2038[lVar24] = uVar12;
      uVar12 = uVar12 + uVar20;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x800);
    if (uVar14 != 0) {
      uVar13 = 0;
      do {
        uVar3 = *(ushort *)((long)pvVar6 + uVar13 * 2);
        uVar12 = local_2038[uVar3];
        local_2038[uVar3] = uVar12 + 1;
        *(int *)((long)pvVar10 + (ulong)uVar12 * 4) = (int)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
    lVar24 = local_2040;
    if (uVar14 != 0) {
      uVar13 = 0;
      lVar25 = 0;
      do {
        uVar12 = *(uint *)((long)pvVar10 + uVar13 * 4);
        uVar18 = (ulong)(uVar12 + 1);
        sVar17 = index_count;
        if (uVar18 < uVar14) {
          sVar17 = (size_t)(uint)(*(int *)((long)pvVar8 + uVar18 * 4) * 3);
        }
        uVar18 = (ulong)(uint)(*(int *)((long)pvVar8 + (ulong)uVar12 * 4) * 3);
        lVar24 = sVar17 - uVar18;
        memcpy(destination + lVar25,local_21f8 + uVar18,lVar24 * 4);
        lVar25 = lVar25 + lVar24;
        uVar13 = uVar13 + 1;
        lVar24 = local_2040;
      } while (uVar14 != uVar13);
    }
  }
  while (lVar24 != 0) {
    (*meshopt_Allocator::StorageT<void>::deallocate)((void *)local_2100[lVar24 + -1]);
    lVar24 = lVar24 + -1;
  }
  return;
}

Assistant:

void meshopt_optimizeOverdraw(unsigned int* destination, const unsigned int* indices, size_t index_count, const float* vertex_positions, size_t vertex_count, size_t vertex_positions_stride, float threshold)
{
	using namespace meshopt;

	assert(index_count % 3 == 0);
	assert(vertex_positions_stride > 0 && vertex_positions_stride <= 256);
	assert(vertex_positions_stride % sizeof(float) == 0);

	meshopt_Allocator allocator;

	// guard for empty meshes
	if (index_count == 0 || vertex_count == 0)
		return;

	// support in-place optimization
	if (destination == indices)
	{
		unsigned int* indices_copy = allocator.allocate<unsigned int>(index_count);
		memcpy(indices_copy, indices, index_count * sizeof(unsigned int));
		indices = indices_copy;
	}

	unsigned int cache_size = 16;

	unsigned int* cache_timestamps = allocator.allocate<unsigned int>(vertex_count);

	// generate hard boundaries from full-triangle cache misses
	unsigned int* hard_clusters = allocator.allocate<unsigned int>(index_count / 3);
	size_t hard_cluster_count = generateHardBoundaries(hard_clusters, indices, index_count, vertex_count, cache_size, cache_timestamps);

	// generate soft boundaries
	unsigned int* soft_clusters = allocator.allocate<unsigned int>(index_count / 3 + 1);
	size_t soft_cluster_count = generateSoftBoundaries(soft_clusters, indices, index_count, vertex_count, hard_clusters, hard_cluster_count, cache_size, threshold, cache_timestamps);

	const unsigned int* clusters = soft_clusters;
	size_t cluster_count = soft_cluster_count;

	// fill sort data
	float* sort_data = allocator.allocate<float>(cluster_count);
	calculateSortData(sort_data, indices, index_count, vertex_positions, vertex_positions_stride, clusters, cluster_count);

	// sort clusters using sort data
	unsigned short* sort_keys = allocator.allocate<unsigned short>(cluster_count);
	unsigned int* sort_order = allocator.allocate<unsigned int>(cluster_count);
	calculateSortOrderRadix(sort_order, sort_data, sort_keys, cluster_count);

	// fill output buffer
	size_t offset = 0;

	for (size_t it = 0; it < cluster_count; ++it)
	{
		unsigned int cluster = sort_order[it];
		assert(cluster < cluster_count);

		size_t cluster_begin = clusters[cluster] * 3;
		size_t cluster_end = (cluster + 1 < cluster_count) ? clusters[cluster + 1] * 3 : index_count;
		assert(cluster_begin < cluster_end);

		memcpy(destination + offset, indices + cluster_begin, (cluster_end - cluster_begin) * sizeof(unsigned int));
		offset += cluster_end - cluster_begin;
	}

	assert(offset == index_count);
}